

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_instance.c
# Opt level: O2

apx_portInstance_t *
apx_portInstance_new
          (apx_nodeInstance_tag *parent,apx_portType_t port_type,apx_portId_t port_id,char *name,
          apx_program_t *pack_program,apx_program_t *unpack_program)

{
  apx_error_t aVar1;
  apx_portInstance_t *self;
  
  self = (apx_portInstance_t *)malloc(0x58);
  if (self != (apx_portInstance_t *)0x0) {
    aVar1 = apx_portInstance_create(self,parent,port_type,port_id,name,pack_program,unpack_program);
    if (aVar1 == 0) {
      return self;
    }
    free(self);
  }
  return (apx_portInstance_t *)0x0;
}

Assistant:

apx_portInstance_t* apx_portInstance_new(struct apx_nodeInstance_tag* parent, apx_portType_t port_type, apx_portId_t port_id,
   char const* name, apx_program_t const* pack_program, apx_program_t const* unpack_program)
{
   apx_portInstance_t* self = (apx_portInstance_t*)malloc(sizeof(apx_portInstance_t));
   if (self != NULL)
   {
      apx_error_t rc = apx_portInstance_create(self, parent, port_type, port_id, name, pack_program, unpack_program);
      if (rc != APX_NO_ERROR)
      {
         free(self);
         self = NULL;
      }
   }
   return self;
}